

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMA_SESSION_Unmarshal(TPMA_SESSION *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = UINT8_Unmarshal((UINT8 *)target,buffer,size);
  if ((TVar1 == 0) && (TVar1 = 0xa1, ((uint)*target & 0x18) == 0)) {
    TVar1 = 0;
  }
  return TVar1;
}

Assistant:

TPM_RC
TPMA_SESSION_Unmarshal(TPMA_SESSION *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT8_Unmarshal((UINT8 *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if(*((UINT8 *)target) & (UINT8)0x18)
        return TPM_RC_RESERVED_BITS;
    return TPM_RC_SUCCESS;
}